

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipstats.cpp
# Opt level: O2

bool __thiscall IPStats::SaveToCsv(IPStats *this,char *file_name)

{
  uint uVar1;
  IPStatsRecord *pIVar2;
  FILE *__stream;
  uint32_t i;
  ulong uVar3;
  long lVar4;
  IPStatsRecord **ppIVar5;
  size_t i_1;
  vector<IPStatsRecord_*,_std::allocator<IPStatsRecord_*>_> records;
  int last_err;
  allocator_type local_31;
  _Vector_base<IPStatsRecord_*,_std::allocator<IPStatsRecord_*>_> local_30;
  int local_14;
  
  local_14 = 0;
  __stream = (FILE *)ithi_file_open_ex(file_name,"wt",&local_14);
  if (__stream != (FILE *)0x0) {
    std::vector<IPStatsRecord_*,_std::allocator<IPStatsRecord_*>_>::vector
              ((vector<IPStatsRecord_*,_std::allocator<IPStatsRecord_*>_> *)&local_30,
               (ulong)(this->ip_records).tableCount,&local_31);
    uVar1 = (this->ip_records).tableSize;
    lVar4 = 0;
    for (uVar3 = 0; uVar3 != uVar1; uVar3 = uVar3 + 1) {
      ppIVar5 = (this->ip_records).hashBin + uVar3;
      while (pIVar2 = *ppIVar5, pIVar2 != (IPStatsRecord *)0x0) {
        local_30._M_impl.super__Vector_impl_data._M_start[lVar4] = pIVar2;
        lVar4 = lVar4 + 1;
        ppIVar5 = &pIVar2->HashNext;
      }
    }
    std::
    __sort<__gnu_cxx::__normal_iterator<IPStatsRecord**,std::vector<IPStatsRecord*,std::allocator<IPStatsRecord*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(IPStatsRecord*,IPStatsRecord*)>>
              ((__normal_iterator<IPStatsRecord_**,_std::vector<IPStatsRecord_*,_std::allocator<IPStatsRecord_*>_>_>
                )local_30._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<IPStatsRecord_**,_std::vector<IPStatsRecord_*,_std::allocator<IPStatsRecord_*>_>_>
                )local_30._M_impl.super__Vector_impl_data._M_finish,
               (_Iter_comp_iter<bool_(*)(IPStatsRecord_*,_IPStatsRecord_*)>)0x198ce2);
    for (uVar3 = 0;
        uVar3 < (ulong)((long)local_30._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_30._M_impl.super__Vector_impl_data._M_start >> 3);
        uVar3 = uVar3 + 1) {
      IPStatsRecord::WriteRecord
                (local_30._M_impl.super__Vector_impl_data._M_start[uVar3],(FILE *)__stream);
    }
    fclose(__stream);
    std::_Vector_base<IPStatsRecord_*,_std::allocator<IPStatsRecord_*>_>::~_Vector_base(&local_30);
  }
  return __stream != (FILE *)0x0;
}

Assistant:

bool IPStats::SaveToCsv(char const* file_name)
{
    bool ret = true;
    int last_err = 0;
    FILE* F = ithi_file_open_ex(file_name, "wt", &last_err);

    if (F == NULL) {
        ret = false;
    }
    else {
        /* Enumerate the records in the binhash, store the keys in a vector */
        std::vector<IPStatsRecord*> records(ip_records.GetCount());
        size_t record_index = 0;

        for (uint32_t i = 0; i < ip_records.GetSize(); i++)
        {
            IPStatsRecord* record = ip_records.GetEntry(i);

            while (record != NULL) {
                records[record_index] = record;
                record_index++;
                record = record->HashNext;
            }
        }
        /* Sort the records by IP addresses */
        std::sort(records.begin(), records.end(), IPAddressIsLower);
        /* print the records to the file */
        for (size_t i = 0; i < records.size(); i++) {
            records[i]->WriteRecord(F);
        }
        /* Close the file */
        fclose(F);
    }

    return ret;
}